

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall testing::internal::UnitTestImpl::ConfigureXmlOutput(UnitTestImpl *this)

{
  bool bVar1;
  XmlUnitTestResultPrinter *this_00;
  JsonUnitTestResultPrinter *this_01;
  ostream *poVar2;
  char *local_58 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  UnitTestOptions::GetOutputFormat_abi_cxx11_();
  bVar1 = std::operator==(&local_38,"xml");
  if (bVar1) {
    this_00 = (XmlUnitTestResultPrinter *)operator_new(0x28);
    UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
    XmlUnitTestResultPrinter::XmlUnitTestResultPrinter(this_00,local_58[0]);
    TestEventListeners::SetDefaultXmlGenerator(&this->listeners_,(TestEventListener *)this_00);
  }
  else {
    bVar1 = std::operator==(&local_38,"json");
    if (!bVar1) {
      bVar1 = std::operator!=(&local_38,"");
      if (bVar1) {
        GTestLog::GTestLog((GTestLog *)local_58,GTEST_WARNING,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/wdeconinck[P]cpp_bindgen/build_O2/_deps/googletest-src/googletest/src/gtest.cc"
                           ,0x1346);
        poVar2 = std::operator<<((ostream *)&std::cerr,"WARNING: unrecognized output format \"");
        poVar2 = std::operator<<(poVar2,(string *)&local_38);
        std::operator<<(poVar2,"\" ignored.");
        GTestLog::~GTestLog((GTestLog *)local_58);
      }
      goto LAB_00112e74;
    }
    this_01 = (JsonUnitTestResultPrinter *)operator_new(0x28);
    UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
    JsonUnitTestResultPrinter::JsonUnitTestResultPrinter(this_01,local_58[0]);
    TestEventListeners::SetDefaultXmlGenerator(&this->listeners_,(TestEventListener *)this_01);
  }
  std::__cxx11::string::~string((string *)local_58);
LAB_00112e74:
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void UnitTestImpl::ConfigureXmlOutput() {
  const std::string& output_format = UnitTestOptions::GetOutputFormat();
  if (output_format == "xml") {
    listeners()->SetDefaultXmlGenerator(new XmlUnitTestResultPrinter(
        UnitTestOptions::GetAbsolutePathToOutputFile().c_str()));
  } else if (output_format == "json") {
    listeners()->SetDefaultXmlGenerator(new JsonUnitTestResultPrinter(
        UnitTestOptions::GetAbsolutePathToOutputFile().c_str()));
  } else if (output_format != "") {
    GTEST_LOG_(WARNING) << "WARNING: unrecognized output format \""
                        << output_format << "\" ignored.";
  }
}